

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O1

err_t btokSMCmdWrap(octet *apdu,size_t *count,apdu_cmd_t *cmd,void *state)

{
  void *state_00;
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  octet *der;
  long lVar8;
  
  bVar1 = apduCmdIsValid(cmd);
  if (bVar1 == 0) {
    return 0x138;
  }
  if ((state != (void *)0x0) && ((cmd->cla & 4) != 0)) {
    return 0x138;
  }
  sVar2 = apduCmdEnc(apdu,cmd);
  if (sVar2 == 0xffffffffffffffff) {
    return 0x138;
  }
  if (state == (void *)0x0) {
    if (count == (size_t *)0x0) {
      return 0;
    }
  }
  else {
    sVar2 = cmd->cdf_len;
    if (sVar2 == 0) {
      lVar5 = 0;
    }
    else {
      sVar3 = derTLEnc((octet *)0x0,0x87,sVar2 + 1);
      lVar5 = sVar2 + sVar3 + 1;
    }
    if (cmd->rdf_len != 0) {
      sVar3 = (ulong)(cmd->cdf_len == 0) + 2;
      sVar2 = 1;
      if (0xff < cmd->cdf_len) {
        sVar2 = sVar3;
      }
      if (0x100 < cmd->rdf_len) {
        sVar2 = sVar3;
      }
      sVar2 = derEnc((octet *)0x0,0x97,(void *)0x0,sVar2);
      lVar5 = lVar5 + sVar2;
    }
    sVar2 = derEnc((octet *)0x0,0x8e,(void *)0x0,8);
    uVar4 = sVar2 + lVar5;
    uVar6 = (ulong)((uint)(0xff < uVar4) * 2);
    lVar5 = uVar6 + 1;
    if (apdu == (octet *)0x0) {
      if (count == (size_t *)0x0) {
        return 0;
      }
      sVar2 = uVar4 + lVar5 + 5;
    }
    else {
      if ((*(byte *)((long)state + 0x40) & 1) == 0) {
        return 0x205;
      }
      *apdu = *apdu | 4;
      uVar7 = uVar6 | 5;
      if (cmd->cdf_len != 0) {
        lVar8 = 0;
        sVar2 = derTLEnc((octet *)0x0,0x87,cmd->cdf_len + 1);
        der = apdu + uVar7;
        uVar7 = cmd->cdf_len;
        if ((uVar7 != 0) && ((0xff < uVar7 || (lVar8 = 1, 0x100 < cmd->rdf_len)))) {
          lVar8 = 3;
        }
        memMove(der + sVar2 + 1,apdu + lVar8 + 4,uVar7);
        der[sVar2] = '\x02';
        sVar2 = derTLEnc(der,0x87,cmd->cdf_len + 1);
        beltCFBStart((void *)((long)state + 0x50),(octet *)((long)state + 0x20),0x20,
                     (octet *)((long)state + 0x40));
        beltCFBStepE(apdu + lVar5 + sVar2 + 5,cmd->cdf_len,(void *)((long)state + 0x50));
        uVar7 = lVar5 + sVar2 + 5 + cmd->cdf_len;
      }
      lVar5 = 4;
      if (0xff < uVar4) {
        apdu[4] = '\0';
        apdu[5] = (octet)(uVar4 >> 8);
        lVar5 = 6;
      }
      apdu[lVar5] = (octet)uVar4;
      if (cmd->rdf_len != 0) {
        sVar3 = (ulong)(cmd->cdf_len == 0) + 2;
        sVar2 = 1;
        if (0xff < cmd->cdf_len) {
          sVar2 = sVar3;
        }
        if (0x100 < cmd->rdf_len) {
          sVar2 = sVar3;
        }
        sVar3 = derTLEnc(apdu + uVar7,0x97,sVar2);
        lVar5 = sVar3 + uVar7;
        if (sVar2 == 2) {
          apdu[lVar5] = *(octet *)((long)&cmd->rdf_len + 1);
          apdu[lVar5 + 1] = (octet)cmd->rdf_len;
        }
        else if (sVar2 == 1) {
          apdu[lVar5] = (octet)cmd->rdf_len;
        }
        else {
          apdu[lVar5] = '\0';
          apdu[lVar5 + 1] = *(octet *)((long)&cmd->rdf_len + 1);
          apdu[lVar5 + 2] = (octet)cmd->rdf_len;
        }
        uVar7 = sVar2 + lVar5;
      }
      state_00 = (void *)((long)state + 0x50);
      beltMACStart(state_00,(octet *)state,0x20);
      beltMACStepA((octet *)((long)state + 0x40),0x10,state_00);
      beltMACStepA(apdu,4,state_00);
      beltMACStepA(apdu + uVar6 + 5,
                   ((ulong)((uint)(uVar4 < 0x100) * 2) | 0xfffffffffffffff9) + uVar7,state_00);
      sVar2 = derTLEnc(apdu + uVar7,0x8e,8);
      lVar5 = sVar2 + uVar7;
      beltMACStepG(apdu + lVar5,state_00);
      memSet(apdu + lVar5 + 8,'\0',1);
      if (count == (size_t *)0x0) {
        return 0;
      }
      sVar2 = lVar5 + 9;
    }
  }
  *count = sVar2;
  return 0;
}

Assistant:

err_t btokSMCmdWrap(octet apdu[], size_t* count, const apdu_cmd_t* cmd,
	void* state)
{
	size_t cdf_len;
	size_t cdf_len_len;
	size_t offset;
	size_t c;
	btok_sm_st* st;
	// pre
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(count, O_PER_S));
	// некорректная команда? команду нужно защитить, а она уже защищена?
	if (!apduCmdIsValid(cmd) || state && (cmd->cla & 0x04))
		return ERR_BAD_APDU;
	// кодировать без защиты
	offset = apduCmdEnc(apdu, cmd);
	if (offset == SIZE_MAX)
		return ERR_BAD_APDU;
	// состояние не задано, т.е. защита не нужна?
	if (!state)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), cmd, apduCmdSizeof(cmd)));
	// новая длина cdf
	cdf_len = cmd->cdf_len;
	if (cmd->cdf_len)
	{
		c = derTLEnc(0, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		cdf_len += c + 1;
	}
	if (cmd->rdf_len)
	{
		c = derEnc(0, 0x97, 0, apduCmdRDFLenLen(cmd));
		ASSERT(c != SIZE_MAX);
		cdf_len += c;
	}
	c = derEnc(0, 0x8E, 0, 8);
	ASSERT(c != SIZE_MAX);
	cdf_len += c;
	// новая длина длины cdf
	cdf_len_len = cdf_len < 256 ? 1 : 3;
	// общая длина
	offset = 4 + cdf_len_len + cdf_len + 1;
	// не задан выходной буфер, т.е. нужно определить только его длину?
	if (!apdu)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
			ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(apdu, offset, state, btokSM_keep()));
	ASSERT(memIsDisjoint2(apdu, offset, cmd, apduCmdSizeof(cmd)));
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 1)
		return ERR_BAD_LOGIC;
	// уточнить заголовок
	offset = 0;
	apdu[0] |= 0x04;
	offset += 4;
	// перейти к cdf
	offset += cdf_len_len;
	// обработать cdf
	if (cmd->cdf_len)
	{
		c = derTLEnc(0, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		// подготовить значение
		memMove(apdu + offset + c + 1,
			apdu + 4 + apduCmdCDFLenLen(cmd), cmd->cdf_len);
		apdu[offset + c] = 0x02;
		// кодировать TL
		c = derTLEnc(apdu + offset, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		offset += c + 1;
		// зашифровать
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepE(apdu + offset, cmd->cdf_len, st->stack);
		// дальше
		offset += cmd->cdf_len;
	}
	// теперь можно перекодировать Lc
	ASSERT(cdf_len_len == 1 || cdf_len_len == 3);
	if (cdf_len_len == 1)
		apdu[4] = (octet)cdf_len;
	else
	{
		apdu[4] = 0;
		apdu[5] = (octet)(cdf_len / 256);
		apdu[6] = (octet)cdf_len;
	}
	// обработать длину rdf
	if (cmd->rdf_len)
	{
		size_t l = apduCmdRDFLenLen(cmd);
		// кодировать TL
		c = derTLEnc(apdu + offset, 0x97, l);
		ASSERT(c != SIZE_MAX);
		offset += c;
		// кодировать значение
		ASSERT(1 <= l && l <= 3);
		if (l == 1)
			apdu[offset] = (octet)(cmd->rdf_len);
		else if (l == 2)
		{
			apdu[offset] = (octet)(cmd->rdf_len / 256);
			apdu[offset + 1] = (octet)cmd->rdf_len;
		}
		else
		{
			apdu[offset] = 0;
			apdu[offset + 1] = (octet)(cmd->rdf_len / 256);
			apdu[offset + 2] = (octet)cmd->rdf_len;
		}
		// дальше
		offset += l;
	}
	// вычислить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, 4, st->stack);
	ASSERT(offset >= 4 + cdf_len_len);
	beltMACStepA(apdu + 4 + cdf_len_len, offset - 4 - cdf_len_len, st->stack);
	c = derTLEnc(apdu + offset, 0x8E, 8);
	ASSERT(c != SIZE_MAX);
	offset += c;
	beltMACStepG(apdu + offset, st->stack);
	offset += 8;
	// кодировать новую длину rdf
	memSetZero(apdu + offset, 1);
	offset += 1;
	// возвратить длину
	if (count)
	{
		ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
		ASSERT(memIsDisjoint2(count, O_PER_S, apdu, offset));
		*count = offset;
	}
	// завершить
	return ERR_OK;
}